

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void FromWabtValues(Store *store,wasm_val_t *values,ValueTypes *types,Values *wabt_values)

{
  ulong uVar1;
  wasm_val_t *store_00;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  pointer *ppTVar6;
  wasm_val_t wVar7;
  TypedValue local_58;
  wasm_valkind_t local_40;
  undefined7 uStack_3f;
  anon_union_8_5_30786955_for_of local_38;
  ulong local_30;
  size_t i;
  Values *wabt_values_local;
  ValueTypes *types_local;
  wasm_val_t *values_local;
  Store *store_local;
  
  i = (size_t)wabt_values;
  wabt_values_local = (Values *)types;
  types_local = (ValueTypes *)values;
  values_local = (wasm_val_t *)store;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  sVar3 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
  if (sVar2 == sVar3) {
    local_30 = 0;
    while( true ) {
      uVar1 = local_30;
      sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)wabt_values_local);
      store_00 = values_local;
      if (sVar2 <= uVar1) break;
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)wabt_values_local,
                          local_30);
      local_58.type.enum_ = pvVar4->enum_;
      pvVar5 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                         ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i,
                          local_30);
      local_58.value.i64_ = pvVar5->i64_;
      local_58.value._8_8_ = *(undefined8 *)((pvVar5->v128_).v + 8);
      wVar7 = FromWabtValue((Store *)store_00,&local_58);
      local_38 = wVar7.of;
      local_40 = wVar7.kind;
      ppTVar6 = &(types_local->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start + local_30 * 2;
      *ppTVar6 = (pointer)CONCAT71(uStack_3f,local_40);
      ((anon_union_8_5_30786955_for_of *)(ppTVar6 + 1))->i64 = (int64_t)local_38;
      local_30 = local_30 + 1;
    }
    return;
  }
  __assert_fail("types.size() == wabt_values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x1e7,
                "void FromWabtValues(Store &, wasm_val_t *, const ValueTypes &, const Values &)");
}

Assistant:

static void FromWabtValues(Store& store,
                           wasm_val_t values[],
                           const ValueTypes& types,
                           const Values& wabt_values) {
  assert(types.size() == wabt_values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    values[i] = FromWabtValue(store, TypedValue{types[i], wabt_values[i]});
  }
}